

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.h
# Opt level: O3

void __thiscall
Memory::RecyclerSweep::
QueueEmptyHeapBlock<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
          (RecyclerSweep *this,
          HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
          *heapBucket,
          SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *heapBlock)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *pSVar5;
  
  if (DAT_015bf420 == '\x01') {
    uVar3 = HeapBucket::GetBucketIndex(&heapBucket->super_HeapBucket);
    if ((HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
         *)(heapBlock->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>).
           super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>.
           super_SmallHeapBlockT<SmallAllocationBlockAttributes>.heapBucket != heapBucket) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                         ,0xa9,"(heapBlock->heapBucket == heapBucket)",
                         "heapBlock->heapBucket == heapBucket");
      if (!bVar2) goto LAB_006dc979;
      *puVar4 = 0;
    }
    SmallHeapBlockT<SmallAllocationBlockAttributes>::BackgroundReleasePagesSweep
              ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)heapBlock,this->recycler);
    pSVar5 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)
             (this->finalizableWithBarrierData).bucketData[uVar3].pendingEmptyBlockList;
    if (pSVar5 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      if ((this->finalizableWithBarrierData).bucketData[uVar3].pendingEmptyBlockListTail !=
          (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                           ,0xb0,"(bucketData.pendingEmptyBlockListTail == nullptr)",
                           "bucketData.pendingEmptyBlockListTail == nullptr");
        if (!bVar2) {
LAB_006dc979:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      (this->finalizableWithBarrierData).bucketData[uVar3].pendingEmptyBlockListTail = heapBlock;
      this->hasPendingEmptyBlocks = true;
      pSVar5 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    }
    (heapBlock->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>).
    super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>.
    super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next = pSVar5;
    (this->finalizableWithBarrierData).bucketData[uVar3].pendingEmptyBlockList = heapBlock;
  }
  return;
}

Assistant:

void
RecyclerSweep::QueueEmptyHeapBlock(HeapBucketT<TBlockType> const *heapBucket, TBlockType * heapBlock)
{
#if ENABLE_BACKGROUND_PAGE_FREEING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        auto& bucketData = this->GetBucketData(heapBucket);
        Assert(heapBlock->heapBucket == heapBucket);

        heapBlock->BackgroundReleasePagesSweep(recycler);

        TBlockType * list = bucketData.pendingEmptyBlockList;
        if (list == nullptr)
        {
            Assert(bucketData.pendingEmptyBlockListTail == nullptr);
            bucketData.pendingEmptyBlockListTail = heapBlock;
            this->hasPendingEmptyBlocks = true;
        }
        heapBlock->SetNextBlock(list);
        bucketData.pendingEmptyBlockList = heapBlock;
    }
#endif
}